

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_engine.h
# Opt level: O2

bool __thiscall
BamTools::FilterEngine<BamTools::BamAlignmentChecker>::setProperty<std::__cxx11::string>
          (FilterEngine<BamTools::BamAlignmentChecker> *this,string *filterName,string *propertyName
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          ValueCompareType *type)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  _Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>,_bool>
  pVar5;
  Variant local_c0;
  ValueCompareType *local_b8;
  PropertyFilterValue local_b0;
  undefined1 local_a0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
                  *)this,filterName);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_filters)._M_t._M_impl.super__Rb_tree_header) {
LAB_0016d148:
    bVar1 = false;
  }
  else {
    local_b8 = type;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>_>
            ::find(iVar2._M_node + 2,propertyName);
    if (iVar3._M_node == (_Base_ptr)&iVar2._M_node[2]._M_parent) {
      std::__cxx11::string::string((string *)&local_50,(string *)value);
      Variant::Variant<std::__cxx11::string>(&local_c0,&local_50);
      if (local_c0.data != (ImplBase *)0x0) {
        (local_c0.data)->refs = (local_c0.data)->refs + 1;
      }
      local_b0.Value.data = local_c0.data;
      local_b0.Type = *local_b8;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
      ::pair<BamTools::PropertyFilterValue,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
                  *)local_a0,propertyName,&local_b0);
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>,std::_Select1st<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,BamTools::PropertyFilterValue>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>,std::_Select1st<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>>
                          *)(iVar2._M_node + 2),
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
                          *)local_a0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
               *)local_a0);
      Variant::~Variant(&local_b0.Value);
      Variant::~Variant(&local_c0);
      std::__cxx11::string::~string((string *)&local_50);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0016d148;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)value);
      Variant::Variant<std::__cxx11::string>((Variant *)local_a0,&local_70);
      Variant::operator=((Variant *)(iVar3._M_node + 2),(Variant *)local_a0);
      Variant::~Variant((Variant *)local_a0);
      std::__cxx11::string::~string((string *)&local_70);
      *(ValueCompareType *)&iVar3._M_node[2]._M_parent = *local_b8;
    }
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((this->m_properties).
                       super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->m_properties).
                       super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>.
                       _M_impl.super__Vector_impl_data._M_finish,propertyName);
    if (_Var4._M_current ==
        (this->m_properties).
        super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)local_a0,(string *)propertyName);
      local_a0[0x20] = true;
      std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::
      emplace_back<BamTools::Property>(&this->m_properties,(Property *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      std::
      __sort<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->m_properties).
                 super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (this->m_properties).
                 super__Vector_base<BamTools::Property,_std::allocator<BamTools::Property>_>._M_impl
                 .super__Vector_impl_data._M_finish);
    }
    else {
      (_Var4._M_current)->IsEnabled = true;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool FilterEngine<FilterChecker>::setProperty(const std::string& filterName,
                                              const std::string& propertyName, const T& value,
                                              const PropertyFilterValue::ValueCompareType& type)
{
    // lookup filter by name, return false if not found
    FilterMap::iterator filterIter = m_filters.find(filterName);
    if (filterIter == m_filters.end()) return false;

    // lookup property for filter, add new PropertyFilterValue if not found, modify if already exists
    PropertyFilter& filter = (*filterIter).second;
    PropertyMap::iterator propertyIter = filter.Properties.find(propertyName);

    bool success;

    // property not found for this filter, create new entry
    if (propertyIter == filter.Properties.end())
        success = (filter.Properties.insert(
                       std::make_pair(propertyName, PropertyFilterValue(value, type))))
                      .second;

    // property already exists, modify
    else {
        PropertyFilterValue& filterValue = (*propertyIter).second;
        filterValue.Value = value;
        filterValue.Type = type;
        success = true;
    }

    // if error so far, return false
    if (!success) return false;

    // --------------------------------------------
    // otherwise, set Property.IsEnabled to true

    // lookup property
    std::vector<Property>::iterator knownPropertyIter =
        std::find(m_properties.begin(), m_properties.end(), propertyName);

    // if not found, create a new (enabled) entry (& re-sort list)
    if (knownPropertyIter == m_properties.end()) {
        m_properties.push_back(Property(propertyName, true));
        std::sort(m_properties.begin(), m_properties.end());
    }

    // property already known, set as enabled
    else
        (*knownPropertyIter).IsEnabled = true;

    // return success
    return true;
}